

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

bool divsufsortxx::helper::
     partition<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (iterator Td,iterator first1,iterator first2,iterator last,iterator *mfirst,
               iterator *mlast,value_type *v)

{
  iterator last1;
  ulong uVar1;
  ulong uVar2;
  BitmapArray<long> *pBVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  pos_type pVar7;
  ulong uVar8;
  long lVar9;
  pos_type pVar10;
  ulong uVar11;
  BitmapArray<long> *pBVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  iterator first1_00;
  iterator first1_01;
  iterator last1_00;
  iterator first2_00;
  ulong local_70;
  ulong local_50;
  undefined4 extraout_var_00;
  
  local_50 = first2.pos_;
  first2_00.array_ = first2.array_;
  pVar7 = first1.pos_;
  pVar10 = Td.pos_;
  pBVar12 = Td.array_;
  if (local_50 < last.pos_) {
    do {
      iVar4 = (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[5])(first2_00.array_,local_50);
      iVar4 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar12,CONCAT44(extraout_var,iVar4) + pVar10);
      lVar6 = CONCAT44(extraout_var_00,iVar4);
      if (lVar6 != *v) break;
      local_50 = local_50 + 1;
    } while (local_50 < last.pos_);
  }
  else {
    lVar6 = 0;
  }
  uVar14 = local_50;
  if (((local_50 < last.pos_) && (lVar6 < *v)) && (uVar14 = local_50 + 1, uVar14 < last.pos_)) {
    do {
      iVar4 = (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[5])(first2_00.array_,uVar14);
      iVar4 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar12,CONCAT44(extraout_var_01,iVar4) + pVar10);
      lVar6 = CONCAT44(extraout_var_02,iVar4);
      if (*v < lVar6) break;
      if (lVar6 == *v) {
        iVar4 = (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[5])(first2_00.array_,uVar14);
        iVar5 = (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[5])(first2_00.array_,local_50);
        (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (first2_00.array_,uVar14,CONCAT44(extraout_var_04,iVar5));
        (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (first2_00.array_,local_50,CONCAT44(extraout_var_03,iVar4));
        local_50 = local_50 + 1;
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < last.pos_);
  }
  pBVar3 = last.array_;
  uVar11 = last.pos_ - 1;
  bVar15 = uVar14 < uVar11;
  uVar8 = uVar11;
  if (bVar15) {
    iVar4 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_);
    lVar6 = CONCAT44(extraout_var_05,iVar4);
    while( true ) {
      iVar4 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])(pBVar12,lVar6 + pVar10);
      lVar6 = CONCAT44(extraout_var_06,iVar4);
      uVar8 = uVar11;
      if (lVar6 != *v) break;
      uVar11 = uVar11 - 1;
      bVar15 = uVar14 < uVar11;
      uVar8 = uVar14;
      if (!bVar15) break;
      iVar4 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,uVar11);
      lVar6 = CONCAT44(extraout_var_07,iVar4);
    }
  }
  local_70 = uVar8;
  if ((bVar15) && (*v < lVar6)) {
    uVar11 = uVar8 - 1;
    uVar1 = uVar11;
    uVar2 = uVar8;
    for (; uVar8 = uVar1, local_70 = uVar2, uVar14 < uVar11; uVar11 = uVar11 - 1) {
      iVar4 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,uVar11);
      iVar4 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar12,CONCAT44(extraout_var_08,iVar4) + pVar10);
      uVar8 = uVar11;
      if (CONCAT44(extraout_var_09,iVar4) < *v) break;
      if (CONCAT44(extraout_var_09,iVar4) == *v) {
        local_70 = uVar2 - 1;
        iVar4 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,uVar11);
        iVar5 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,uVar2);
        (*(pBVar3->super_Bitmap)._vptr_Bitmap[4])(pBVar3,uVar11,CONCAT44(extraout_var_11,iVar5));
        (*(pBVar3->super_Bitmap)._vptr_Bitmap[4])(pBVar3,uVar2,CONCAT44(extraout_var_10,iVar4));
      }
      uVar1 = uVar14;
      uVar2 = local_70;
    }
  }
  if (uVar14 < uVar8) {
    do {
      iVar4 = (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[5])(first2_00.array_,uVar14);
      iVar5 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,uVar8);
      (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[4])
                (first2_00.array_,uVar14,CONCAT44(extraout_var_13,iVar5));
      (*(pBVar3->super_Bitmap)._vptr_Bitmap[4])(pBVar3,uVar8,CONCAT44(extraout_var_12,iVar4));
      uVar11 = uVar14 + 1;
      uVar14 = uVar11;
      if (uVar11 < uVar8) {
        do {
          iVar4 = (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[5])(first2_00.array_,uVar11);
          iVar4 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])
                            (pBVar12,CONCAT44(extraout_var_14,iVar4) + pVar10);
          uVar14 = uVar11;
          if (*v < CONCAT44(extraout_var_15,iVar4)) break;
          if (CONCAT44(extraout_var_15,iVar4) == *v) {
            iVar4 = (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[5])(first2_00.array_,uVar11);
            iVar5 = (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[5])(first2_00.array_,local_50)
            ;
            (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[4])
                      (first2_00.array_,uVar11,CONCAT44(extraout_var_17,iVar5));
            (*((first2_00.array_)->super_Bitmap)._vptr_Bitmap[4])
                      (first2_00.array_,local_50,CONCAT44(extraout_var_16,iVar4));
            local_50 = local_50 + 1;
          }
          uVar11 = uVar11 + 1;
          uVar14 = uVar8;
        } while (uVar8 != uVar11);
      }
      uVar11 = uVar8 - 1;
      uVar8 = uVar11;
      uVar1 = local_70;
      for (; local_70 = uVar1, uVar14 < uVar11; uVar11 = uVar11 - 1) {
        iVar4 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,uVar11);
        iVar4 = (*(pBVar12->super_Bitmap)._vptr_Bitmap[5])
                          (pBVar12,CONCAT44(extraout_var_18,iVar4) + pVar10);
        uVar8 = uVar11;
        if (CONCAT44(extraout_var_19,iVar4) < *v) break;
        if (CONCAT44(extraout_var_19,iVar4) == *v) {
          local_70 = uVar1 - 1;
          iVar4 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,uVar11);
          iVar5 = (*(pBVar3->super_Bitmap)._vptr_Bitmap[5])(pBVar3,uVar1);
          (*(pBVar3->super_Bitmap)._vptr_Bitmap[4])(pBVar3,uVar11,CONCAT44(extraout_var_21,iVar5));
          (*(pBVar3->super_Bitmap)._vptr_Bitmap[4])(pBVar3,uVar1,CONCAT44(extraout_var_20,iVar4));
        }
        uVar8 = uVar14;
        uVar1 = local_70;
      }
    } while (uVar14 < uVar8);
  }
  if (local_70 < local_50) {
    mfirst->array_ = first1.array_;
    mfirst->pos_ = pVar7;
    if (mlast == &last) goto LAB_0010da74;
    mlast->array_ = last.array_;
  }
  else {
    lVar13 = uVar14 - local_50;
    lVar6 = local_50 - pVar7;
    if (lVar13 < (long)(local_50 - pVar7)) {
      lVar6 = lVar13;
    }
    first1_00.pos_ = uVar14 - lVar6;
    first1_00.array_ = first2_00.array_;
    last1_00.pos_ = uVar14;
    last1_00.array_ = first2_00.array_;
    vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              (first1_00,last1_00,first1);
    lVar9 = (local_70 - uVar14) + 1;
    last1.pos_ = last.pos_;
    last1.array_ = last.array_;
    lVar6 = ~local_70 + last.pos_;
    if (lVar9 <= (long)(~local_70 + last.pos_)) {
      lVar6 = lVar9;
    }
    first1_01.pos_ = last.pos_ - lVar6;
    first1_01.array_ = last.array_;
    first2_00.pos_ = uVar14;
    vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              (first1_01,last1,first2_00);
    mfirst->array_ = first1.array_;
    mfirst->pos_ = lVar13 + pVar7;
    last.pos_ = last.pos_ - lVar9;
    mlast->array_ = last.array_;
  }
  mlast->pos_ = last.pos_;
LAB_0010da74:
  return local_50 <= local_70;
}

Assistant:

bool partition(
    const StringIterator_type Td, SAIterator_type first1,
    SAIterator_type first2, SAIterator_type last, SAIterator_type &mfirst,
    SAIterator_type &mlast,
    const typename std::iterator_traits<StringIterator_type>::value_type &v) {
  SAIterator_type a, b, c, d;
  typename std::iterator_traits<StringIterator_type>::value_type x = 0;

  for (b = first2; (b < last) && ((x = Td[*b]) == v); ++b) {
  }
  if (((a = b) < last) && (x < v)) {
    for (; (++b < last) && ((x = Td[*b]) <= v);) {
      if (x == v) {
        std::iter_swap(b, a++);
      }
    }
  }
  for (c = last; (b < --c) && ((x = Td[*c]) == v);) {
  }
  if ((b < (d = c)) && (x > v)) {
    for (; (b < --c) && ((x = Td[*c]) >= v);) {
      if (x == v) {
        std::iter_swap(c, d--);
      }
    }
  }
  for (; b < c;) {
    std::iter_swap(b, c);
    for (; (++b < c) && ((x = Td[*b]) <= v);) {
      if (x == v) {
        std::iter_swap(b, a++);
      }
    }
    for (; (b < --c) && ((x = Td[*c]) >= v);) {
      if (x == v) {
        std::iter_swap(c, d--);
      }
    }
  }

  if (a <= d) {
    vecswap(b - std::min(a - first1, b - a), b, first1);
    vecswap(last - std::min(d + 1 - b, last - d - 1), last, b);
    mfirst = first1 + (b - a), mlast = last - (d + 1 - b);
    return true;
  }
  mfirst = first1, mlast = last;
  return false;
}